

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O2

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,1>::
applyThisOnTheLeft<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,1,1,1,1,1>>
          (HouseholderSequence<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,1>
           *this,Matrix<double,_4,_1,_0,_4,_1> *dst,Matrix<double,_1,_1,_1,_1,_1> *workspace)

{
  long lVar1;
  long k_00;
  Index k;
  long lVar2;
  EssentialVectorType local_80;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>> local_58 [40];
  
  lVar1 = -1;
  for (lVar2 = 0; lVar2 < *(long *)(this + 0x18); lVar2 = lVar2 + 1) {
    k_00 = *(long *)(this + 0x18) + lVar1;
    if (this[0x10] !=
        (HouseholderSequence<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,1>)0x0)
    {
      k_00 = lVar2;
    }
    DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::bottomRows
              ((RowsBlockXpr *)local_58,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)dst,
               4 - (*(long *)(this + 0x20) + k_00));
    HouseholderSequence<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>
    ::essentialVector(&local_80,
                      (HouseholderSequence<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>
                       *)this,k_00);
    MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::
    applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>const,_1,1,false>>
              (local_58,&local_80,(Scalar *)(k_00 * 8 + *(long *)(this + 8)),(Scalar *)workspace);
    lVar1 = lVar1 + -1;
  }
  return;
}

Assistant:

inline void applyThisOnTheLeft(Dest& dst, Workspace& workspace) const
    {
      workspace.resize(dst.cols());
      for(Index k = 0; k < m_length; ++k)
      {
        Index actual_k = m_trans ? k : m_length-k-1;
        dst.bottomRows(rows()-m_shift-actual_k)
           .applyHouseholderOnTheLeft(essentialVector(actual_k), m_coeffs.coeff(actual_k), workspace.data());
      }
    }